

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O2

void updateNormalHints(_GLFWwindow *window,int width,int height)

{
  int iVar1;
  XSizeHints *pXVar2;
  ulong uVar3;
  long lVar4;
  long lStack_40;
  long supplied;
  
  pXVar2 = (*_glfw.x11.xlib.AllocSizeHints)();
  (*_glfw.x11.xlib.GetWMNormalHints)(_glfw.x11.display,(window->x11).handle,pXVar2,&supplied);
  uVar3 = pXVar2->flags & 0xffffffffffffff4f;
  pXVar2->flags = uVar3;
  if (window->monitor == (_GLFWmonitor *)0x0) {
    if (window->resizable == 0) {
      pXVar2->flags = uVar3 | 0x30;
      pXVar2->max_width = width;
      pXVar2->min_width = width;
      lVar4 = 0x1c;
      lStack_40 = 0x24;
    }
    else {
      if ((window->minwidth != -1) && (window->minheight != -1)) {
        uVar3 = uVar3 | 0x10;
        pXVar2->flags = uVar3;
        pXVar2->min_width = window->minwidth;
        pXVar2->min_height = window->minheight;
      }
      if ((window->maxwidth != -1) && (window->maxheight != -1)) {
        uVar3 = uVar3 | 0x20;
        pXVar2->flags = uVar3;
        pXVar2->max_width = window->maxwidth;
        pXVar2->max_height = window->maxheight;
      }
      if ((window->numer == -1) || (window->denom == -1)) goto LAB_001aac6b;
      pXVar2->flags = uVar3 | 0x80;
      iVar1 = window->numer;
      (pXVar2->max_aspect).x = iVar1;
      (pXVar2->min_aspect).x = iVar1;
      height = window->denom;
      lVar4 = 0x34;
      lStack_40 = 0x3c;
    }
    *(int *)((long)&pXVar2->flags + lStack_40) = height;
    *(int *)((long)&pXVar2->flags + lVar4) = height;
  }
LAB_001aac6b:
  (*_glfw.x11.xlib.SetWMNormalHints)(_glfw.x11.display,(window->x11).handle,pXVar2);
  (*_glfw.x11.xlib.Free)(pXVar2);
  return;
}

Assistant:

static void updateNormalHints(_GLFWwindow* window, int width, int height)
{
    XSizeHints* hints = XAllocSizeHints();

    long supplied;
    XGetWMNormalHints(_glfw.x11.display, window->x11.handle, hints, &supplied);

    hints->flags &= ~(PMinSize | PMaxSize | PAspect);

    if (!window->monitor)
    {
        if (window->resizable)
        {
            if (window->minwidth != GLFW_DONT_CARE &&
                window->minheight != GLFW_DONT_CARE)
            {
                hints->flags |= PMinSize;
                hints->min_width = window->minwidth;
                hints->min_height = window->minheight;
            }

            if (window->maxwidth != GLFW_DONT_CARE &&
                window->maxheight != GLFW_DONT_CARE)
            {
                hints->flags |= PMaxSize;
                hints->max_width = window->maxwidth;
                hints->max_height = window->maxheight;
            }

            if (window->numer != GLFW_DONT_CARE &&
                window->denom != GLFW_DONT_CARE)
            {
                hints->flags |= PAspect;
                hints->min_aspect.x = hints->max_aspect.x = window->numer;
                hints->min_aspect.y = hints->max_aspect.y = window->denom;
            }
        }
        else
        {
            hints->flags |= (PMinSize | PMaxSize);
            hints->min_width  = hints->max_width  = width;
            hints->min_height = hints->max_height = height;
        }
    }

    XSetWMNormalHints(_glfw.x11.display, window->x11.handle, hints);
    XFree(hints);
}